

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O0

void __thiscall adios2::profiling::Timer::~Timer(Timer *this)

{
  string *in_RDI;
  
  std::__cxx11::string::~string(in_RDI + 0x58);
  std::__cxx11::string::~string(in_RDI + 0x38);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

~Timer() = default;